

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O0

int __thiscall
OpenMesh::IO::_OFFReader_::getColorType(_OFFReader_ *this,string *_line,bool _texCoordsAvailable)

{
  string *psVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  string local_98 [8];
  string c1;
  int local_74;
  long lStack_70;
  int count;
  size_t found;
  string local_48 [39];
  byte local_21;
  string *psStack_20;
  bool _texCoordsAvailable_local;
  string *_line_local;
  _OFFReader_ *this_local;
  
  local_21 = _texCoordsAvailable;
  psStack_20 = _line;
  _line_local = (string *)this;
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    while( true ) {
      lVar3 = std::__cxx11::string::size();
      bVar6 = false;
      if (lVar3 != 0) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_20);
        iVar2 = isspace((int)*pcVar4);
        bVar6 = iVar2 != 0;
      }
      if (!bVar6) break;
      std::__cxx11::string::substr((ulong)local_48,(ulong)psStack_20);
      std::__cxx11::string::operator=((string *)psStack_20,local_48);
      std::__cxx11::string::~string(local_48);
    }
    while( true ) {
      lVar3 = std::__cxx11::string::size();
      psVar1 = psStack_20;
      bVar6 = false;
      if (lVar3 != 0) {
        std::__cxx11::string::length();
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psVar1);
        iVar2 = isspace((int)*pcVar4);
        bVar6 = iVar2 != 0;
      }
      psVar1 = psStack_20;
      if (!bVar6) break;
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&found,(ulong)psVar1);
      std::__cxx11::string::operator=((string *)psStack_20,(string *)&found);
      std::__cxx11::string::~string((string *)&found);
    }
    local_74 = 0;
    lStack_70 = std::__cxx11::string::find_first_of((char *)psStack_20,0x37378a);
    while (lStack_70 != -1) {
      local_74 = local_74 + 1;
      lStack_70 = std::__cxx11::string::find_first_of((char *)psStack_20,0x37378a);
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      local_74 = local_74 + 1;
    }
    if ((local_21 & 1) != 0) {
      local_74 = local_74 + -2;
    }
    if ((local_74 == 3) || (local_74 == 4)) {
      std::__cxx11::string::find((char *)psStack_20,0x37378a);
      std::__cxx11::string::substr((ulong)local_98,(ulong)psStack_20);
      lVar3 = std::__cxx11::string::find((char *)local_98,0x371efa);
      if (lVar3 != -1) {
        if (local_74 == 3) {
          local_74 = 5;
        }
        else {
          local_74 = 6;
        }
      }
      std::__cxx11::string::~string(local_98);
    }
    this_local._4_4_ = local_74;
  }
  return this_local._4_4_;
}

Assistant:

int _OFFReader_::getColorType(std::string& _line, bool _texCoordsAvailable) const
{
/*
  0 : no Color
  1 : one int (e.g colormap index)
  2 : two items (error!)
  3 : 3 ints
  4 : 3 ints
  5 : 3 floats
  6 : 4 floats

*/
	// Check if we have any additional information here
	if ( _line.size() < 1 )
		return 0;

    //first remove spaces at start/end of the line
    while (_line.size() > 0 && std::isspace(_line[0]))
      _line = _line.substr(1);
    while (_line.size() > 0 && std::isspace(_line[ _line.length()-1 ]))
      _line = _line.substr(0, _line.length()-1);

    //count the remaining items in the line
    size_t found;
    int count = 0;

    found=_line.find_first_of(" ");
    while (found!=std::string::npos){
      count++;
      found=_line.find_first_of(" ",found+1);
    }

    if (!_line.empty()) count++;

    if (_texCoordsAvailable) count -= 2;

    if (count == 3 || count == 4){
      //get first item
      found = _line.find(" ");
      std::string c1 = _line.substr (0,found);

      if (c1.find(".") != std::string::npos){
        if (count == 3)
          count = 5;
        else
          count = 6;
      }
    }
  return count;
}